

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
FxVectorBuiltin::FxVectorBuiltin(FxVectorBuiltin *this,FxExpression *self,FName *name)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,&self->ScriptPosition)
  ;
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  *(undefined8 *)&(this->super_FxExpression).ExprType = 0x3f;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxVectorBuiltin_0070cc08;
  this->Self = self;
  (this->Function).Index = name->Index;
  return;
}

Assistant:

FxVectorBuiltin::FxVectorBuiltin(FxExpression *self, FName name)
	:FxExpression(EFX_VectorBuiltin, self->ScriptPosition)
{
	Self = self;
	Function = name;
}